

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSParser::composePlayList(MPLSParser *this,BitStreamWriter *writer)

{
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *pmtIndexList;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint32_t uVar7;
  MPLSStreamInfo *pMVar8;
  pointer pmVar9;
  pointer pmVar10;
  size_t PlayItem_id;
  ulong uVar11;
  int local_60;
  
  puVar3 = (writer->super_BitStream).m_buffer;
  puVar4 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  uVar11 = 0;
  BitStreamWriter::putBits(writer,0x20,0);
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  pMVar8 = getMainStream(this);
  pmtIndexList = &(pMVar8->super_M2TSStreamInfo).m_index;
  BitStreamWriter::putBits
            (writer,0x10,
             (uint)(((long)(pMVar8->super_M2TSStreamInfo).m_index.
                           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pMVar8->super_M2TSStreamInfo).m_index.
                          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  BitStreamWriter::putBits(writer,0x10,this->number_of_SubPaths);
  while( true ) {
    pmVar10 = (pMVar8->super_M2TSStreamInfo).m_index.
              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar9 = (pMVar8->super_M2TSStreamInfo).m_index.
             super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pmVar9 - (long)pmVar10) / 0x30) <= uVar11) break;
    composePlayItem(this,writer,uVar11,pmtIndexList);
    uVar11 = uVar11 + 1;
  }
  for (uVar11 = 0;
      uVar11 < (ulong)((((long)pmVar9 - (long)pmVar10) / 0x30) * (long)this->number_of_SubPaths);
      uVar11 = uVar11 + 1) {
    composeSubPath(this,writer,((long)pmVar9 - (long)pmVar10) % 0x30,pmtIndexList,this->subPath_type
                  );
    pmVar10 = (pMVar8->super_M2TSStreamInfo).m_index.
              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar9 = (pMVar8->super_M2TSStreamInfo).m_index.
             super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_60 = (int)puVar6;
  uVar7 = my_ntohl((int)(uVar2 + ((int)puVar5 - local_60) * 8) / -8 +
                   (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8);
  *(uint32_t *)((long)puVar4 + (long)((int)(uVar1 + ((int)puVar3 - (int)puVar4) * 8) / 8)) = uVar7;
  return;
}

Assistant:

void MPLSParser::composePlayList(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    writer.putBits(16, 0);  // reserved_for_future_use
    const MPLSStreamInfo& mainStreamInfo = getMainStream();
    writer.putBits(16, static_cast<unsigned>(mainStreamInfo.m_index.size()));  // number_of_PlayItems
    writer.putBits(16, number_of_SubPaths);                                    // number_of_SubPaths
    // connection_condition = 1;
    for (size_t PlayItem_id = 0; PlayItem_id < mainStreamInfo.m_index.size(); PlayItem_id++)
    {
        composePlayItem(writer, PlayItem_id, mainStreamInfo.m_index);
        // connection_condition = 6;
    }

    const MPLSStreamInfo& dependStreamInfo = mainStreamInfo;

    for (size_t SubPath_id = 0; SubPath_id < number_of_SubPaths * dependStreamInfo.m_index.size(); SubPath_id++)
    {
        composeSubPath(writer, SubPath_id, dependStreamInfo.m_index, subPath_type);  // pip
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}